

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

void __thiscall DRunningScript::Destroy(DRunningScript *this)

{
  DFsVariable *pDVar1;
  DFsVariable *next;
  DFsVariable *current;
  int i;
  DRunningScript *this_local;
  
  for (current._4_4_ = 0; current._4_4_ < 0x10; current._4_4_ = current._4_4_ + 1) {
    next = ::TObjPtr::operator_cast_to_DFsVariable_((TObjPtr *)(this->variables + current._4_4_));
    while (next != (DFsVariable *)0x0) {
      pDVar1 = ::TObjPtr::operator_cast_to_DFsVariable_((TObjPtr *)&next->next);
      (*(next->super_DObject)._vptr_DObject[4])();
      next = pDVar1;
    }
    TObjPtr<DFsVariable>::operator=(this->variables + current._4_4_,(DFsVariable *)0x0);
  }
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DRunningScript::Destroy()
{
	int i;
	DFsVariable *current, *next;
	
	for(i=0; i<VARIABLESLOTS; i++)
    {
		current = variables[i];
		
		// go thru this chain
		while(current)
		{
			next = current->next; // save for after freeing
			current->Destroy();
			current = next; // go to next in chain
		}
		variables[i] = NULL;
    }
	Super::Destroy();
}